

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

size_t __thiscall ODDLParser::DataArrayList::size(DataArrayList *this)

{
  size_t sVar1;
  DataArrayList *pDVar2;
  
  pDVar2 = this->m_next;
  sVar1 = 0;
  if (pDVar2 == (DataArrayList *)0x0) {
    sVar1 = (size_t)(this->m_dataList != (Value *)0x0);
  }
  else {
    for (; pDVar2 != (DataArrayList *)0x0; pDVar2 = pDVar2->m_next) {
      sVar1 = sVar1 + 1;
    }
  }
  return sVar1;
}

Assistant:

size_t DataArrayList::size() {
    size_t result( 0 );
    if ( ddl_nullptr == m_next ) {
        if ( m_dataList != ddl_nullptr ) {
            result = 1;
        }
        return result;
    }

    DataArrayList *n( m_next );
    while( ddl_nullptr != n ) {
        result++;
        n = n->m_next;
    }
    return result;
}